

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v6::internal::
          parse_arg_id<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t wVar2;
  int id;
  long lVar3;
  wchar_t *pwVar4;
  basic_string_view<wchar_t> id_00;
  wchar_t *begin_local;
  
  wVar2 = *begin;
  pwVar4 = begin;
  begin_local = begin;
  if ((wVar2 == L'}') || (wVar2 == L':')) {
    id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
    ::operator()(handler);
  }
  else if ((uint)(wVar2 + L'\xffffffd0') < 10) {
    if (wVar2 == L'0') {
      begin_local = begin + 1;
      id = 0;
    }
    else {
      id = parse_nonnegative_int<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
                     (&begin_local,end,handler);
    }
    if ((begin_local == end) || ((*begin_local != L':' && (*begin_local != L'}')))) {
      id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::on_error(handler,"invalid format string");
      pwVar4 = begin_local;
    }
    else {
      id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::operator()(handler,id);
      pwVar4 = begin_local;
    }
  }
  else if ((wVar2 == L'_') || ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a)) {
    lVar1 = 4;
    do {
      lVar3 = lVar1;
      pwVar4 = (wchar_t *)((long)begin + lVar3);
      if (pwVar4 == end) break;
      wVar2 = *pwVar4;
      lVar1 = lVar3 + 4;
    } while ((((uint)(wVar2 + L'\xffffffd0') < 10) || (wVar2 == L'_')) ||
            ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a));
    id_00.size_ = lVar3 >> 2;
    id_00.data_ = begin;
    id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
    ::operator()(handler,id_00);
  }
  else {
    id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
    ::on_error(handler,"invalid format string");
  }
  return pwVar4;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}